

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O2

void test_divceil<std::vector<signed_char,std::allocator<signed_char>>,unsigned_long>
               (vector<signed_char,_std::allocator<signed_char>_> *values,unsigned_long divisor,
               size_t attempt_count)

{
  char cVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  char cVar5;
  bool bVar6;
  
  cVar5 = '\0';
  lVar2 = std::chrono::_V2::steady_clock::now();
  while (bVar6 = attempt_count != 0, attempt_count = attempt_count - 1, bVar6) {
    cVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char,test_divceil<std::vector<signed_char,std::allocator<signed_char>>,unsigned_long>(std::vector<signed_char,std::allocator<signed_char>>const&,unsigned_long,unsigned_long)::_lambda(auto:1,auto:2)_1_>
                      ((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )(values->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        )(values->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish,'\0',
                       (anon_class_8_1_e7267f7e)divisor);
    cVar5 = cVar5 + cVar1;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  poVar4 = std::operator<<((ostream *)&std::clog,cVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_1fcde);
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}